

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frequency_transform.cc
# Opt level: O0

bool __thiscall
sptk::FrequencyTransform::Run
          (FrequencyTransform *this,vector<double,_std::allocator<double>_> *minimum_phase_sequence,
          vector<double,_std::allocator<double>_> *warped_sequence,Buffer *buffer)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last_00;
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  long in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  double *in_RDI;
  double dVar6;
  int m;
  int i;
  double *g;
  double *d;
  double *c;
  double beta;
  int output_length;
  int input_length;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff28;
  int iVar7;
  undefined4 in_stack_ffffffffffffff2c;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff30;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff38;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff40;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff48;
  
  iVar1 = *(int *)(in_RDI + 1);
  if ((((((ulong)in_RDI[3] & 1) == 0) ||
       (sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar2 != (long)(iVar1 + 1))) || (in_RDX == (vector<double,_std::allocator<double>_> *)0x0))
     || (in_RCX == 0)) {
    return false;
  }
  iVar1 = *(int *)((long)in_RDI + 0xc) + 1;
  sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
  if (sVar2 != (long)iVar1) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40._M_current,
               (size_type)in_stack_ffffffffffffff38._M_current);
  }
  sVar2 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RCX + 8));
  if (sVar2 != (long)iVar1) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40._M_current,
               (size_type)in_stack_ffffffffffffff38._M_current);
  }
  if ((in_RDI[2] == 0.0) && (!NAN(in_RDI[2]))) {
    if (*(int *)(in_RDI + 1) < *(int *)((long)in_RDI + 0xc)) {
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff18);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
      std::
      copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                (difference_type)in_RDI);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff18);
      __last._M_current._4_4_ = in_stack_ffffffffffffff2c;
      __last._M_current._0_4_ = in_stack_ffffffffffffff28;
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (in_stack_ffffffffffffff30,__last,in_RDI);
    }
    else {
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
      __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
                CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                (difference_type)in_RDI);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
      std::
      copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    return true;
  }
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff18);
  __last_00._M_current._4_4_ = in_stack_ffffffffffffff2c;
  __last_00._M_current._0_4_ = in_stack_ffffffffffffff28;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (in_stack_ffffffffffffff30,__last_00,in_RDI);
  dVar6 = -in_RDI[2] * in_RDI[2] + 1.0;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RCX + 8),0);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
  for (iVar1 = *(int *)(in_RDI + 1); -1 < iVar1; iVar1 = iVar1 + -1) {
    *pvVar4 = *pvVar5;
    *pvVar5 = in_RDI[2] * *pvVar4 + pvVar3[iVar1];
    if (0 < *(int *)((long)in_RDI + 0xc)) {
      pvVar4[1] = pvVar5[1];
      pvVar5[1] = dVar6 * *pvVar4 + in_RDI[2] * pvVar4[1];
    }
    for (iVar7 = 2; iVar7 <= *(int *)((long)in_RDI + 0xc); iVar7 = iVar7 + 1) {
      pvVar4[iVar7] = pvVar5[iVar7];
      pvVar5[iVar7] = in_RDI[2] * (pvVar4[iVar7] - pvVar5[iVar7 + -1]) + pvVar4[iVar7 + -1];
    }
  }
  return true;
}

Assistant:

bool FrequencyTransform::Run(const std::vector<double>& minimum_phase_sequence,
                             std::vector<double>* warped_sequence,
                             FrequencyTransform::Buffer* buffer) const {
  // Check inputs.
  const int input_length(num_input_order_ + 1);
  if (!is_valid_ ||
      minimum_phase_sequence.size() != static_cast<std::size_t>(input_length) ||
      NULL == warped_sequence || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(num_output_order_ + 1);
  if (warped_sequence->size() != static_cast<std::size_t>(output_length)) {
    warped_sequence->resize(output_length);
  }
  if (buffer->d_.size() != static_cast<std::size_t>(output_length)) {
    buffer->d_.resize(output_length);
  }

  // There is no need to convert input when alpha is zero.
  if (0.0 == alpha_) {
    if (num_input_order_ < num_output_order_) {
      std::copy(minimum_phase_sequence.begin(), minimum_phase_sequence.end(),
                warped_sequence->begin());
      std::fill(warped_sequence->begin() + input_length, warped_sequence->end(),
                0.0);
    } else {
      std::copy(minimum_phase_sequence.begin(),
                minimum_phase_sequence.begin() + output_length,
                warped_sequence->begin());
    }
    return true;
  }

  std::fill(warped_sequence->begin(), warped_sequence->end(), 0.0);

  const double beta(1.0 - alpha_ * alpha_);
  const double* c(&(minimum_phase_sequence[0]));
  double* d(&buffer->d_[0]);
  double* g(&((*warped_sequence)[0]));

  // Apply recursive formula.
  for (int i(num_input_order_); 0 <= i; --i) {
    d[0] = g[0];
    g[0] = c[i] + alpha_ * d[0];
    if (1 <= num_output_order_) {
      d[1] = g[1];
      g[1] = beta * d[0] + alpha_ * d[1];
    }
    for (int m(2); m <= num_output_order_; ++m) {
      d[m] = g[m];
      g[m] = d[m - 1] + alpha_ * (d[m] - g[m - 1]);
    }
  }

  return true;
}